

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.h
# Opt level: O0

bool llvm::DWARFDebugLine::Sequence::orderByHighPC(Sequence *LHS,Sequence *RHS)

{
  bool bVar1;
  tuple<const_unsigned_long_&,_const_unsigned_long_&> local_38;
  tuple<const_unsigned_long_&,_const_unsigned_long_&> local_28;
  Sequence *local_18;
  Sequence *RHS_local;
  Sequence *LHS_local;
  
  local_18 = RHS;
  RHS_local = LHS;
  std::tie<unsigned_long_const,unsigned_long_const>((unsigned_long *)&local_28,&LHS->SectionIndex);
  std::tie<unsigned_long_const,unsigned_long_const>
            ((unsigned_long *)&local_38,&local_18->SectionIndex);
  bVar1 = std::operator<(&local_28,&local_38);
  return bVar1;
}

Assistant:

static bool orderByHighPC(const Sequence &LHS, const Sequence &RHS) {
      return std::tie(LHS.SectionIndex, LHS.HighPC) <
             std::tie(RHS.SectionIndex, RHS.HighPC);
    }